

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_cursor.hpp
# Opt level: O1

void __thiscall
jsoncons::bson::basic_bson_cursor<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
basic_bson_cursor<std::__cxx11::istringstream&>
          (basic_bson_cursor<jsoncons::stream_source<unsigned_char>,std::allocator<char>> *this,
          allocator<char> *param_2,
          basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_> *param_3,
          bson_decode_options *param_4,undefined8 param_5)

{
  char cVar1;
  
  *(undefined8 *)this = 0xb5a068;
  *(undefined8 *)(this + 0x2a0) = 0xb5a108;
  basic_bson_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
  basic_bson_parser<std::__cxx11::istringstream&>
            ((basic_bson_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>> *)
             (this + 8),param_3,param_4,param_2);
  *(undefined ***)(this + 0x238) = &PTR__basic_json_visitor_00b59940;
  *(undefined2 *)(this + 0x240) = 3;
  *(undefined4 *)(this + 0x268) = 0;
  *(undefined8 *)(this + 0x248) = 0;
  *(undefined8 *)(this + 0x250) = 0;
  *(undefined8 *)(this + 0x254) = 0;
  *(undefined8 *)(this + 0x25c) = 0;
  *(undefined8 *)(this + 0x270) = 0;
  *(undefined8 *)(this + 0x278) = 0;
  *(undefined8 *)(this + 0x280) = 0;
  *(undefined8 *)(this + 0x288) = 0;
  *(undefined8 *)(this + 0x289) = 0;
  *(undefined8 *)(this + 0x291) = 0;
  this[0x12] = (basic_bson_cursor<jsoncons::stream_source<unsigned_char>,std::allocator<char>>)0x1;
  cVar1 = (**(code **)(*(long *)this + 0x18))(this);
  if (cVar1 == '\0') {
    (**(code **)(*(long *)this + 0x40))(this,param_5);
  }
  return;
}

Assistant:

basic_bson_cursor(std::allocator_arg_t, const Allocator& alloc, 
        Sourceable&& source,
        const bson_decode_options& options,
        std::error_code& ec)
       : parser_(std::forward<Sourceable>(source), options, alloc)
    {
        parser_.cursor_mode(true);
        if (!done())
        {
            next(ec);
        }
    }